

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O0

void check_quest_items(dw_rom *rom)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  bool bVar5;
  code *local_28;
  _func_BOOL_uint8_t *quest_item_check;
  int iStack_14;
  uint8_t tmp_item;
  int tmp_index;
  int i;
  dw_rom *rom_local;
  
  printf("Checking quest item placement...\n");
  local_28 = is_quest_item;
  if ((rom->flags[10] & 0x30) != 0) {
    printf("Disallowing Armor in Charlock...\n");
    local_28 = is_quest_item_incl_armor;
  }
  for (iStack_14 = 0; iStack_14 < 0x1f; iStack_14 = iStack_14 + 1) {
    if (((rom->chest_access[iStack_14] & 0x88) != 0) &&
       (iVar2 = (*local_28)(rom->chests[iStack_14].item), iVar2 != 0)) {
      do {
        iVar2 = non_charlock_chest(rom);
        iVar3 = (*local_28)(rom->chests[iVar2].item);
        bVar5 = true;
        if (iVar3 == 0) {
          BVar4 = is_static_chest(rom->chests + iVar2);
          bVar5 = BVar4 != FALSE;
        }
      } while (bVar5);
      uVar1 = rom->chests[iVar2].item;
      rom->chests[iVar2].item = rom->chests[iStack_14].item;
      rom->chests[iStack_14].item = uVar1;
    }
  }
  return;
}

Assistant:

void check_quest_items(dw_rom *rom)
{
    int i, tmp_index;
    uint8_t tmp_item;
    BOOL (*quest_item_check)(uint8_t item);

    printf("Checking quest item placement...\n");

    quest_item_check = &is_quest_item;

    if (NO_ARMOR_IN_CHARLOCK(rom)) {
        printf("Disallowing Armor in Charlock...\n");
        quest_item_check = &is_quest_item_incl_armor;
    }

    for (i=0; i < CHEST_COUNT; i++) {
        if (rom->chest_access[i] & 0x88) {
            if ((*quest_item_check)(rom->chests[i].item)) {
                do {
                    tmp_index = non_charlock_chest(rom);
                } while ((*quest_item_check)(rom->chests[tmp_index].item) 
                        || is_static_chest(&rom->chests[tmp_index]));
                tmp_item = rom->chests[tmp_index].item;
                rom->chests[tmp_index].item = rom->chests[i].item;
                rom->chests[i].item = tmp_item;
            }
        }
    }
}